

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::DescribeParser::DoBodyLine(DescribeParser *this)

{
  string local_30 [32];
  
  if (*(this->super_LineParser).Line._M_dataplus._M_p == '\t') {
    std::__cxx11::string::substr((ulong)local_30,(ulong)&(this->super_LineParser).Line);
    std::__cxx11::string::append((string *)&(this->Rev).Log);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::append((char *)&(this->Rev).Log);
  return;
}

Assistant:

void DoBodyLine()
  {
    if (this->Line[0] == '\t') {
      this->Rev.Log += this->Line.substr(1);
    }
    this->Rev.Log += "\n";
  }